

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractsocket.cpp
# Opt level: O2

void __thiscall
QAbstractSocketPrivate::startConnectingByName(QAbstractSocketPrivate *this,QString *host)

{
  QAbstractSocket *this_00;
  bool bVar1;
  char cVar2;
  SocketState SVar3;
  SocketError SVar4;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->state & ~HostLookupState) != ConnectingState) {
    this_00 = *(QAbstractSocket **)&this->field_0x8;
    this->state = ConnectingState;
    QAbstractSocket::stateChanged(this_00,ConnectingState);
    if (this->cachedSocketDescriptor == -1) {
      bVar1 = initSocketLayer(this,UnknownNetworkLayerProtocol);
      if (bVar1) goto LAB_001b2cd6;
    }
    else {
LAB_001b2cd6:
      cVar2 = (**(code **)(*(long *)this->socketEngine + 0x88))(this->socketEngine,host,this->port);
      if (cVar2 != '\0') {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
          fetchConnectionParameters(this);
          return;
        }
        goto LAB_001b2da8;
      }
      SVar3 = QAbstractSocketEngine::state((QAbstractSocketEngine *)this->socketEngine);
      if (SVar3 == ConnectingState) goto LAB_001b2d8d;
      SVar4 = QAbstractSocketEngine::error((QAbstractSocketEngine *)this->socketEngine);
      QAbstractSocketEngine::errorString
                ((QString *)&local_40,(QAbstractSocketEngine *)this->socketEngine);
      this->socketError = SVar4;
      QString::operator=((QString *)&this->field_0x168,(QString *)&local_40);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
    }
    this->state = UnconnectedState;
    QAbstractSocket::errorOccurred(this_00,this->socketError);
    QAbstractSocket::stateChanged(this_00,this->state);
  }
LAB_001b2d8d:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
LAB_001b2da8:
  __stack_chk_fail();
}

Assistant:

void QAbstractSocketPrivate::startConnectingByName(const QString &host)
{
    Q_Q(QAbstractSocket);
    if (state == QAbstractSocket::ConnectingState || state == QAbstractSocket::ConnectedState)
        return;

#if defined(QABSTRACTSOCKET_DEBUG)
    qDebug("QAbstractSocketPrivate::startConnectingByName(host == %s)", qPrintable(host));
#endif

    // ### Let the socket engine drive this?
    state = QAbstractSocket::ConnectingState;
    emit q->stateChanged(state);

    if (cachedSocketDescriptor != -1 || initSocketLayer(QAbstractSocket::UnknownNetworkLayerProtocol)) {
        // Try to connect to the host. If it succeeds immediately
        // (e.g. QSocks5SocketEngine in UDPASSOCIATE mode), emit
        // connected() and return.
        if (socketEngine->connectToHostByName(host, port)) {
            fetchConnectionParameters();
            return;
        }

        if (socketEngine->state() == QAbstractSocket::ConnectingState)
            return;

        // failed to connect
        setError(socketEngine->error(), socketEngine->errorString());
    }

    state = QAbstractSocket::UnconnectedState;
    emit q->errorOccurred(socketError);
    emit q->stateChanged(state);
}